

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.cpp
# Opt level: O2

void gf256_add_mem(void *vx,void *vy,int bytes)

{
  uint *puVar1;
  byte *pbVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  __m128i *y16;
  long lVar35;
  __m128i *x16;
  
  if (CpuHasAVX2) {
    for (; 0x7f < bytes; bytes = bytes - 0x80) {
      uVar3 = *vy;
      uVar4 = *(uint *)((long)vy + 4);
      uVar5 = *(uint *)((long)vy + 8);
      uVar6 = *(uint *)((long)vy + 0xc);
      uVar7 = *(uint *)((long)vy + 0x10);
      uVar8 = *(uint *)((long)vy + 0x14);
      uVar9 = *(uint *)((long)vy + 0x18);
      uVar10 = *(uint *)((long)vy + 0x1c);
      uVar11 = *(uint *)((long)vy + 0x20);
      uVar12 = *(uint *)((long)vy + 0x24);
      uVar13 = *(uint *)((long)vy + 0x28);
      uVar14 = *(uint *)((long)vy + 0x2c);
      uVar15 = *(uint *)((long)vy + 0x30);
      uVar16 = *(uint *)((long)vy + 0x34);
      uVar17 = *(uint *)((long)vy + 0x38);
      uVar18 = *(uint *)((long)vy + 0x3c);
      uVar19 = *(uint *)((long)vy + 0x40);
      uVar20 = *(uint *)((long)vy + 0x44);
      uVar21 = *(uint *)((long)vy + 0x48);
      uVar22 = *(uint *)((long)vy + 0x4c);
      uVar23 = *(uint *)((long)vy + 0x50);
      uVar24 = *(uint *)((long)vy + 0x54);
      uVar25 = *(uint *)((long)vy + 0x58);
      uVar26 = *(uint *)((long)vy + 0x5c);
      uVar27 = *(uint *)((long)vy + 0x60);
      uVar28 = *(uint *)((long)vy + 100);
      uVar29 = *(uint *)((long)vy + 0x68);
      uVar30 = *(uint *)((long)vy + 0x6c);
      uVar31 = *(uint *)((long)vy + 0x70);
      uVar32 = *(uint *)((long)vy + 0x74);
      uVar33 = *(uint *)((long)vy + 0x78);
      uVar34 = *(uint *)((long)vy + 0x7c);
      vy = (void *)((long)vy + 0x80);
      *(uint *)vx = uVar3 ^ (uint)*vx;
      *(uint *)((long)vx + 4) = uVar4 ^ *(uint *)((long)vx + 4);
      *(uint *)((long)vx + 8) = uVar5 ^ (uint)*(ulong *)((long)vx + 8);
      *(uint *)((long)vx + 0xc) = uVar6 ^ *(uint *)((long)vx + 0xc);
      *(uint *)((long)vx + 0x10) = uVar7 ^ (uint)*(ulong *)((long)vx + 0x10);
      *(uint *)((long)vx + 0x14) = uVar8 ^ *(uint *)((long)vx + 0x14);
      *(uint *)((long)vx + 0x18) = uVar9 ^ (uint)*(ulong *)((long)vx + 0x18);
      *(uint *)((long)vx + 0x1c) = uVar10 ^ *(uint *)((long)vx + 0x1c);
      *(uint *)((long)vx + 0x20) = uVar11 ^ (uint)*(ulong *)((long)vx + 0x20);
      *(uint *)((long)vx + 0x24) = uVar12 ^ *(uint *)((long)vx + 0x24);
      *(uint *)((long)vx + 0x28) = uVar13 ^ (uint)*(ulong *)((long)vx + 0x28);
      *(uint *)((long)vx + 0x2c) = uVar14 ^ *(uint *)((long)vx + 0x2c);
      *(uint *)((long)vx + 0x30) = uVar15 ^ (uint)*(ulong *)((long)vx + 0x30);
      *(uint *)((long)vx + 0x34) = uVar16 ^ *(uint *)((long)vx + 0x34);
      *(uint *)((long)vx + 0x38) = uVar17 ^ (uint)*(ulong *)((long)vx + 0x38);
      *(uint *)((long)vx + 0x3c) = uVar18 ^ *(uint *)((long)vx + 0x3c);
      *(uint *)((long)vx + 0x40) = uVar19 ^ (uint)*(ulong *)((long)vx + 0x40);
      *(uint *)((long)vx + 0x44) = uVar20 ^ *(uint *)((long)vx + 0x44);
      *(uint *)((long)vx + 0x48) = uVar21 ^ (uint)*(ulong *)((long)vx + 0x48);
      *(uint *)((long)vx + 0x4c) = uVar22 ^ *(uint *)((long)vx + 0x4c);
      *(uint *)((long)vx + 0x50) = uVar23 ^ (uint)*(ulong *)((long)vx + 0x50);
      *(uint *)((long)vx + 0x54) = uVar24 ^ *(uint *)((long)vx + 0x54);
      *(uint *)((long)vx + 0x58) = uVar25 ^ (uint)*(ulong *)((long)vx + 0x58);
      *(uint *)((long)vx + 0x5c) = uVar26 ^ *(uint *)((long)vx + 0x5c);
      *(uint *)((long)vx + 0x60) = uVar27 ^ (uint)*(ulong *)((long)vx + 0x60);
      *(uint *)((long)vx + 100) = uVar28 ^ *(uint *)((long)vx + 100);
      *(uint *)((long)vx + 0x68) = uVar29 ^ (uint)*(ulong *)((long)vx + 0x68);
      *(uint *)((long)vx + 0x6c) = uVar30 ^ *(uint *)((long)vx + 0x6c);
      *(uint *)((long)vx + 0x70) = uVar31 ^ (uint)*(ulong *)((long)vx + 0x70);
      *(uint *)((long)vx + 0x74) = uVar32 ^ *(uint *)((long)vx + 0x74);
      *(uint *)((long)vx + 0x78) = uVar33 ^ (uint)*(ulong *)((long)vx + 0x78);
      *(uint *)((long)vx + 0x7c) = uVar34 ^ *(uint *)((long)vx + 0x7c);
      vx = (void *)((long)vx + 0x80);
    }
    for (; 0x1f < bytes; bytes = bytes - 0x20) {
      uVar3 = *vy;
      uVar4 = *(uint *)((long)vy + 4);
      uVar5 = *(uint *)((long)vy + 8);
      uVar6 = *(uint *)((long)vy + 0xc);
      uVar7 = *(uint *)((long)vy + 0x10);
      uVar8 = *(uint *)((long)vy + 0x14);
      uVar9 = *(uint *)((long)vy + 0x18);
      uVar10 = *(uint *)((long)vy + 0x1c);
      vy = (void *)((long)vy + 0x20);
      *(uint *)vx = uVar3 ^ (uint)*vx;
      *(uint *)((long)vx + 4) = uVar4 ^ *(uint *)((long)vx + 4);
      *(uint *)((long)vx + 8) = uVar5 ^ (uint)*(ulong *)((long)vx + 8);
      *(uint *)((long)vx + 0xc) = uVar6 ^ *(uint *)((long)vx + 0xc);
      *(uint *)((long)vx + 0x10) = uVar7 ^ (uint)*(ulong *)((long)vx + 0x10);
      *(uint *)((long)vx + 0x14) = uVar8 ^ *(uint *)((long)vx + 0x14);
      *(uint *)((long)vx + 0x18) = uVar9 ^ (uint)*(ulong *)((long)vx + 0x18);
      *(uint *)((long)vx + 0x1c) = uVar10 ^ *(uint *)((long)vx + 0x1c);
      vx = (void *)((long)vx + 0x20);
    }
  }
  else {
    for (; 0x3f < bytes; bytes = bytes - 0x40) {
      uVar3 = *vy;
      uVar4 = *(uint *)((long)vy + 4);
      uVar5 = *(uint *)((long)vy + 8);
      uVar6 = *(uint *)((long)vy + 0xc);
      uVar7 = *(uint *)((long)vy + 0x10);
      uVar8 = *(uint *)((long)vy + 0x14);
      uVar9 = *(uint *)((long)vy + 0x18);
      uVar10 = *(uint *)((long)vy + 0x1c);
      uVar11 = *(uint *)((long)vy + 0x20);
      uVar12 = *(uint *)((long)vy + 0x24);
      uVar13 = *(uint *)((long)vy + 0x28);
      uVar14 = *(uint *)((long)vy + 0x2c);
      uVar15 = *(uint *)((long)vy + 0x30);
      uVar16 = *(uint *)((long)vy + 0x34);
      uVar17 = *(uint *)((long)vy + 0x38);
      uVar18 = *(uint *)((long)vy + 0x3c);
      vy = (void *)((long)vy + 0x40);
      *(uint *)vx = uVar3 ^ (uint)*vx;
      *(uint *)((long)vx + 4) = uVar4 ^ *(uint *)((long)vx + 4);
      *(uint *)((long)vx + 8) = uVar5 ^ (uint)*(ulong *)((long)vx + 8);
      *(uint *)((long)vx + 0xc) = uVar6 ^ *(uint *)((long)vx + 0xc);
      *(uint *)((long)vx + 0x10) = uVar7 ^ (uint)*(ulong *)((long)vx + 0x10);
      *(uint *)((long)vx + 0x14) = uVar8 ^ *(uint *)((long)vx + 0x14);
      *(uint *)((long)vx + 0x18) = uVar9 ^ (uint)*(ulong *)((long)vx + 0x18);
      *(uint *)((long)vx + 0x1c) = uVar10 ^ *(uint *)((long)vx + 0x1c);
      *(uint *)((long)vx + 0x20) = uVar11 ^ (uint)*(ulong *)((long)vx + 0x20);
      *(uint *)((long)vx + 0x24) = uVar12 ^ *(uint *)((long)vx + 0x24);
      *(uint *)((long)vx + 0x28) = uVar13 ^ (uint)*(ulong *)((long)vx + 0x28);
      *(uint *)((long)vx + 0x2c) = uVar14 ^ *(uint *)((long)vx + 0x2c);
      *(uint *)((long)vx + 0x30) = uVar15 ^ (uint)*(ulong *)((long)vx + 0x30);
      *(uint *)((long)vx + 0x34) = uVar16 ^ *(uint *)((long)vx + 0x34);
      *(uint *)((long)vx + 0x38) = uVar17 ^ (uint)*(ulong *)((long)vx + 0x38);
      *(uint *)((long)vx + 0x3c) = uVar18 ^ *(uint *)((long)vx + 0x3c);
      vx = (void *)((long)vx + 0x40);
    }
  }
  lVar35 = (long)vy + 2;
  for (; 0xf < bytes; bytes = bytes - 0x10) {
    puVar1 = (uint *)(lVar35 + -2);
    uVar3 = *(uint *)(lVar35 + 2);
    uVar4 = *(uint *)(lVar35 + 6);
    uVar5 = *(uint *)(lVar35 + 10);
    lVar35 = lVar35 + 0x10;
    *(uint *)vx = *puVar1 ^ (uint)*vx;
    *(uint *)((long)vx + 4) = uVar3 ^ *(uint *)((long)vx + 4);
    *(uint *)((long)vx + 8) = uVar4 ^ (uint)*(ulong *)((long)vx + 8);
    *(uint *)((long)vx + 0xc) = uVar5 ^ *(uint *)((long)vx + 0xc);
    vx = (void *)((long)vx + 0x10);
  }
  if ((bytes & 8U) != 0) {
    *(ulong *)vx = *vx ^ *(ulong *)(lVar35 + -2);
  }
  if ((bytes & 4U) != 0) {
    puVar1 = (uint *)((long)vx + (ulong)(bytes & 8));
    *puVar1 = *puVar1 ^ *(uint *)(lVar35 + -2 + (ulong)(bytes & 8));
  }
  switch(bytes & 3) {
  case 0:
    return;
  case 3:
    pbVar2 = (byte *)((long)vx + (ulong)(bytes & 0xc) + 2);
    *pbVar2 = *pbVar2 ^ *(byte *)(lVar35 + (ulong)(bytes & 0xc));
  case 2:
    pbVar2 = (byte *)((long)vx + (ulong)(bytes & 0xc) + 1);
    *pbVar2 = *pbVar2 ^ *(byte *)(lVar35 + -1 + (ulong)(bytes & 0xc));
  case 1:
    pbVar2 = (byte *)((long)vx + (ulong)(bytes & 0xc));
    *pbVar2 = *pbVar2 ^ *(byte *)(lVar35 + -2 + (ulong)(bytes & 0xc));
    return;
  }
}

Assistant:

void gf256_add_mem(void * GF256_RESTRICT vx,
                              const void * GF256_RESTRICT vy, int bytes)
{
    GF256_M128 * GF256_RESTRICT x16 = reinterpret_cast<GF256_M128 *>(vx);
    const GF256_M128 * GF256_RESTRICT y16 = reinterpret_cast<const GF256_M128 *>(vy);

#if defined(GF256_TARGET_MOBILE)
# if defined(GF256_TRY_NEON)
    // Handle multiples of 64 bytes
    if (CpuHasNeon)
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*) x16);
            GF256_M128 x1 = vld1q_u8((uint8_t*)(x16 + 1) );
            GF256_M128 x2 = vld1q_u8((uint8_t*)(x16 + 2) );
            GF256_M128 x3 = vld1q_u8((uint8_t*)(x16 + 3) );
            GF256_M128 y0 = vld1q_u8((uint8_t*)y16);
            GF256_M128 y1 = vld1q_u8((uint8_t*)(y16 + 1));
            GF256_M128 y2 = vld1q_u8((uint8_t*)(y16 + 2));
            GF256_M128 y3 = vld1q_u8((uint8_t*)(y16 + 3));

            vst1q_u8((uint8_t*)x16,     veorq_u8(x0, y0));
            vst1q_u8((uint8_t*)(x16 + 1), veorq_u8(x1, y1));
            vst1q_u8((uint8_t*)(x16 + 2), veorq_u8(x2, y2));
            vst1q_u8((uint8_t*)(x16 + 3), veorq_u8(x3, y3));

            bytes -= 64, x16 += 4, y16 += 4;
        }

        // Handle multiples of 16 bytes
        while (bytes >= 16)
        {
            GF256_M128 x0 = vld1q_u8((uint8_t*)x16);
            GF256_M128 y0 = vld1q_u8((uint8_t*)y16);

            vst1q_u8((uint8_t*)x16, veorq_u8(x0, y0));

            bytes -= 16, ++x16, ++y16;
        }
    }
    else
# endif // GF256_TRY_NEON
    {
        uint64_t * GF256_RESTRICT x8 = reinterpret_cast<uint64_t *>(x16);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y16);

        const unsigned count = (unsigned)bytes / 8;
        for (unsigned ii = 0; ii < count; ++ii)
            x8[ii] ^= y8[ii];

        x16 = reinterpret_cast<GF256_M128 *>(x8 + count);
        y16 = reinterpret_cast<const GF256_M128 *>(y8 + count);

        bytes -= (count * 8);
    }
#else // GF256_TARGET_MOBILE
# if defined(GF256_TRY_AVX2)
    if (CpuHasAVX2)
    {
        GF256_M256 * GF256_RESTRICT x32 = reinterpret_cast<GF256_M256 *>(x16);
        const GF256_M256 * GF256_RESTRICT y32 = reinterpret_cast<const GF256_M256 *>(y16);

        while (bytes >= 128)
        {
            GF256_M256 x0 = _mm256_loadu_si256(x32);
            GF256_M256 y0 = _mm256_loadu_si256(y32);
            x0 = _mm256_xor_si256(x0, y0);
            GF256_M256 x1 = _mm256_loadu_si256(x32 + 1);
            GF256_M256 y1 = _mm256_loadu_si256(y32 + 1);
            x1 = _mm256_xor_si256(x1, y1);
            GF256_M256 x2 = _mm256_loadu_si256(x32 + 2);
            GF256_M256 y2 = _mm256_loadu_si256(y32 + 2);
            x2 = _mm256_xor_si256(x2, y2);
            GF256_M256 x3 = _mm256_loadu_si256(x32 + 3);
            GF256_M256 y3 = _mm256_loadu_si256(y32 + 3);
            x3 = _mm256_xor_si256(x3, y3);

            _mm256_storeu_si256(x32, x0);
            _mm256_storeu_si256(x32 + 1, x1);
            _mm256_storeu_si256(x32 + 2, x2);
            _mm256_storeu_si256(x32 + 3, x3);

            bytes -= 128, x32 += 4, y32 += 4;
        }

        // Handle multiples of 32 bytes
        while (bytes >= 32)
        {
            // x[i] = x[i] xor y[i]
            _mm256_storeu_si256(x32,
                _mm256_xor_si256(
                    _mm256_loadu_si256(x32),
                    _mm256_loadu_si256(y32)));

            bytes -= 32, ++x32, ++y32;
        }

        x16 = reinterpret_cast<GF256_M128 *>(x32);
        y16 = reinterpret_cast<const GF256_M128 *>(y32);
    }
    else
# endif // GF256_TRY_AVX2
    {
        while (bytes >= 64)
        {
            GF256_M128 x0 = _mm_loadu_si128(x16);
            GF256_M128 y0 = _mm_loadu_si128(y16);
            x0 = _mm_xor_si128(x0, y0);
            GF256_M128 x1 = _mm_loadu_si128(x16 + 1);
            GF256_M128 y1 = _mm_loadu_si128(y16 + 1);
            x1 = _mm_xor_si128(x1, y1);
            GF256_M128 x2 = _mm_loadu_si128(x16 + 2);
            GF256_M128 y2 = _mm_loadu_si128(y16 + 2);
            x2 = _mm_xor_si128(x2, y2);
            GF256_M128 x3 = _mm_loadu_si128(x16 + 3);
            GF256_M128 y3 = _mm_loadu_si128(y16 + 3);
            x3 = _mm_xor_si128(x3, y3);

            _mm_storeu_si128(x16, x0);
            _mm_storeu_si128(x16 + 1, x1);
            _mm_storeu_si128(x16 + 2, x2);
            _mm_storeu_si128(x16 + 3, x3);

            bytes -= 64, x16 += 4, y16 += 4;
        }
    }
#endif // GF256_TARGET_MOBILE

#if !defined(GF256_TARGET_MOBILE)
    // Handle multiples of 16 bytes
    while (bytes >= 16)
    {
        // x[i] = x[i] xor y[i]
        _mm_storeu_si128(x16,
            _mm_xor_si128(
                _mm_loadu_si128(x16),
                _mm_loadu_si128(y16)));

        bytes -= 16, ++x16, ++y16;
    }
#endif

    uint8_t * GF256_RESTRICT x1 = reinterpret_cast<uint8_t *>(x16);
    const uint8_t * GF256_RESTRICT y1 = reinterpret_cast<const uint8_t *>(y16);

    // Handle a block of 8 bytes
    const int eight = bytes & 8;
    if (eight)
    {
        uint64_t * GF256_RESTRICT x8 = reinterpret_cast<uint64_t *>(x1);
        const uint64_t * GF256_RESTRICT y8 = reinterpret_cast<const uint64_t *>(y1);
        *x8 ^= *y8;
    }

    // Handle a block of 4 bytes
    const int four = bytes & 4;
    if (four)
    {
        uint32_t * GF256_RESTRICT x4 = reinterpret_cast<uint32_t *>(x1 + eight);
        const uint32_t * GF256_RESTRICT y4 = reinterpret_cast<const uint32_t *>(y1 + eight);
        *x4 ^= *y4;
    }

    // Handle final bytes
    const int offset = eight + four;
    switch (bytes & 3)
    {
    case 3: x1[offset + 2] ^= y1[offset + 2];
    case 2: x1[offset + 1] ^= y1[offset + 1];
    case 1: x1[offset] ^= y1[offset];
    default:
        break;
    }
}